

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O2

void mempool_align(void)

{
  void *pvVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  int i;
  long lVar3;
  char *cache;
  uint uVar4;
  void *pvStack_138;
  void *ptr [32];
  
  plan(1);
  _space(_stdout);
  cache = "mempool_align";
  printf("# *** %s ***\n");
  uVar4 = 8;
  uVar2 = extraout_RDX;
  do {
    if (0xfff < uVar4) {
      _ok(1,"true",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/mempool.c",0x76,
          "line %d",0x76);
      _space(_stdout);
      printf("# *** %s: done ***\n","mempool_align");
      check_plan();
      return;
    }
    mempool_create((mempool *)(ulong)uVar4,(slab_cache *)cache,(uint32_t)uVar2);
    lVar3 = 0;
    while (lVar3 != 0x20) {
      pvVar1 = mempool_alloc(&pool);
      ptr[lVar3 + -1] = pvVar1;
      lVar3 = lVar3 + 1;
      if (((ulong)uVar4 - 1 & (ulong)pvVar1) != 0) {
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","aligment","wrong",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/mempool.c"
                ,0x70,"mempool_align");
        exit(-1);
      }
    }
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
      mempool_free((mempool *)ptr[lVar3 + -1],cache);
    }
    mempool_destroy(&pool);
    uVar4 = uVar4 * 2;
    uVar2 = extraout_RDX_00;
  } while( true );
}

Assistant:

void
mempool_align()
{
	plan(1);
	header();

	for (uint32_t size = OBJSIZE_MIN; size < OBJSIZE_MAX; size <<= 1) {
		mempool_create(&pool, &cache, size);
		void *ptr[32];
		for (int i = 0; i < (int)lengthof(ptr); i++) {
			ptr[i] = mempool_alloc(&pool);
			uintptr_t addr = (uintptr_t)ptr[i];
			if (addr % size)
				fail("aligment", "wrong");
		}
		for (int i = 0; i < (int)lengthof(ptr); i++)
			mempool_free(&pool, ptr[i]);
		mempool_destroy(&pool);
	}
	ok(true);

	footer();
	check_plan();
}